

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# struct_light_calib.cpp
# Opt level: O0

bool svd(vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
         *A,int K,
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        *U,vector<double,_std::allocator<double>_> *S,
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        *V)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  int iVar5;
  size_type sVar6;
  reference pvVar7;
  time_t tVar8;
  ulong uVar9;
  double *x;
  double *x_00;
  void *__dest;
  double *x_01;
  reference pvVar10;
  void *this;
  double dVar11;
  double d;
  int local_b8;
  int i_7;
  int i_6;
  int j_1;
  int i_5;
  int i_4;
  int j;
  int i_3;
  int iter;
  int i_2;
  double r;
  double diff;
  int col_1;
  int col;
  double *next_right_vector;
  double *right_vector;
  double *next_left_vector;
  double *left_vector;
  int local_54;
  value_type_conflict2 vStack_50;
  int i_1;
  int local_44;
  value_type_conflict2 vStack_40;
  int i;
  int local_38;
  int local_34;
  int N;
  int M;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *V_local;
  vector<double,_std::allocator<double>_> *S_local;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *U_local;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *pvStack_10;
  int K_local;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *A_local;
  
  _N = V;
  V_local = (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             *)S;
  S_local = (vector<double,_std::allocator<double>_> *)U;
  U_local._4_4_ = K;
  pvStack_10 = A;
  sVar6 = std::
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ::size(A);
  local_34 = (int)sVar6;
  pvVar7 = std::
           vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ::operator[](A,0);
  sVar6 = std::vector<double,_std::allocator<double>_>::size(pvVar7);
  local_38 = (int)sVar6;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::clear((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           *)S_local);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::clear(_N);
  std::vector<double,_std::allocator<double>_>::clear
            ((vector<double,_std::allocator<double>_> *)V_local);
  vStack_40 = 0.0;
  std::vector<double,_std::allocator<double>_>::resize
            ((vector<double,_std::allocator<double>_> *)V_local,(long)U_local._4_4_,
             &stack0xffffffffffffffc0);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::resize((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            *)S_local,(long)U_local._4_4_);
  for (local_44 = 0; local_44 < U_local._4_4_; local_44 = local_44 + 1) {
    pvVar7 = std::
             vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           *)S_local,(long)local_44);
    vStack_50 = 0.0;
    std::vector<double,_std::allocator<double>_>::resize
              (pvVar7,(long)local_34,&stack0xffffffffffffffb0);
  }
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::resize(_N,(long)U_local._4_4_);
  for (local_54 = 0; local_54 < U_local._4_4_; local_54 = local_54 + 1) {
    pvVar7 = std::
             vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ::operator[](_N,(long)local_54);
    left_vector = (double *)0x0;
    std::vector<double,_std::allocator<double>_>::resize
              (pvVar7,(long)local_38,(value_type_conflict2 *)&left_vector);
  }
  tVar8 = time((time_t *)0x0);
  srand((uint)tVar8);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)local_34;
  uVar9 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar9 = 0xffffffffffffffff;
  }
  x = (double *)operator_new__(uVar9);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)local_34;
  uVar9 = SUB168(auVar2 * ZEXT816(8),0);
  if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
    uVar9 = 0xffffffffffffffff;
  }
  x_00 = (double *)operator_new__(uVar9);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = (long)local_38;
  uVar9 = SUB168(auVar3 * ZEXT816(8),0);
  if (SUB168(auVar3 * ZEXT816(8),8) != 0) {
    uVar9 = 0xffffffffffffffff;
  }
  __dest = operator_new__(uVar9);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = (long)local_38;
  uVar9 = SUB168(auVar4 * ZEXT816(8),0);
  if (SUB168(auVar4 * ZEXT816(8),8) != 0) {
    uVar9 = 0xffffffffffffffff;
  }
  x_01 = (double *)operator_new__(uVar9);
  diff._0_4_ = 0;
  do {
    if (U_local._4_4_ <= diff._0_4_) {
LAB_00116292:
      if (x_00 != (double *)0x0) {
        operator_delete__(x_00);
      }
      if (x_01 != (double *)0x0) {
        operator_delete__(x_01);
      }
      if (x != (double *)0x0) {
        operator_delete__(x);
      }
      if (__dest != (void *)0x0) {
        operator_delete__(__dest);
      }
      return true;
    }
    r = 1.0;
    _iter = -1.0;
    do {
      for (i_3 = 0; i_3 < local_34; i_3 = i_3 + 1) {
        iVar5 = rand();
        x[i_3] = (double)((float)iVar5 / 2.1474836e+09);
      }
      dVar11 = normalize(x,local_34);
    } while (dVar11 <= eps);
    for (j = 0; eps <= r && j < MAX_ITER; j = j + 1) {
      memset(x_00,0,(long)local_34 << 3);
      memset(x_01,0,(long)local_38 << 3);
      for (i_4 = 0; i_4 < local_34; i_4 = i_4 + 1) {
        for (i_5 = 0; i_5 < local_38; i_5 = i_5 + 1) {
          dVar11 = x[i_4];
          pvVar7 = std::
                   vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ::operator[](A,(long)i_4);
          pvVar10 = std::vector<double,_std::allocator<double>_>::operator[](pvVar7,(long)i_5);
          x_01[i_5] = dVar11 * *pvVar10 + x_01[i_5];
        }
      }
      _iter = normalize(x_01,local_38);
      if (_iter < eps) break;
      for (j_1 = 0; j_1 < diff._0_4_; j_1 = j_1 + 1) {
        pvVar7 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[](_N,(long)j_1);
        pvVar10 = std::vector<double,_std::allocator<double>_>::operator[](pvVar7,0);
        orth(pvVar10,x_01,local_38);
      }
      normalize(x_01,local_38);
      for (i_6 = 0; i_6 < local_34; i_6 = i_6 + 1) {
        for (i_7 = 0; i_7 < local_38; i_7 = i_7 + 1) {
          dVar11 = x_01[i_7];
          pvVar7 = std::
                   vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ::operator[](A,(long)i_6);
          pvVar10 = std::vector<double,_std::allocator<double>_>::operator[](pvVar7,(long)i_7);
          x_00[i_6] = dVar11 * *pvVar10 + x_00[i_6];
        }
      }
      _iter = normalize(x_00,local_34);
      if (_iter < eps) break;
      for (local_b8 = 0; local_b8 < diff._0_4_; local_b8 = local_b8 + 1) {
        pvVar7 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                               *)S_local,(long)local_b8);
        pvVar10 = std::vector<double,_std::allocator<double>_>::operator[](pvVar7,0);
        orth(pvVar10,x_00,local_34);
      }
      normalize(x_00,local_34);
      r = 0.0;
      for (d._4_4_ = 0; d._4_4_ < local_34; d._4_4_ = d._4_4_ + 1) {
        r = (x_00[d._4_4_] - x[d._4_4_]) * (x_00[d._4_4_] - x[d._4_4_]) + r;
      }
      memcpy(x,x_00,(long)local_34 << 3);
      memcpy(__dest,x_01,(long)local_38 << 3);
    }
    if (_iter < eps) {
      this = (void *)std::ostream::operator<<(&std::cout,_iter);
      std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
      goto LAB_00116292;
    }
    pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                        ((vector<double,_std::allocator<double>_> *)V_local,(long)diff._0_4_);
    *pvVar10 = _iter;
    pvVar7 = std::
             vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           *)S_local,(long)diff._0_4_);
    pvVar10 = std::vector<double,_std::allocator<double>_>::operator[](pvVar7,0);
    memcpy(pvVar10,x,(long)local_34 << 3);
    pvVar7 = std::
             vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ::operator[](_N,(long)diff._0_4_);
    pvVar10 = std::vector<double,_std::allocator<double>_>::operator[](pvVar7,0);
    memcpy(pvVar10,__dest,(long)local_38 << 3);
    diff._0_4_ = diff._0_4_ + 1;
  } while( true );
}

Assistant:

bool svd(vector<vector<double> > A, int K, vector<vector<double> > &U, vector<double> &S, vector<vector<double> > &V) {
	int M = A.size();
	int N = A[0].size();
	U.clear();
	V.clear();
	S.clear();
	S.resize(K, 0);
	U.resize(K);
	for (int i = 0; i < K; i++)
		U[i].resize(M, 0);
	V.resize(K);
	for (int i = 0; i < K; i++)
		V[i].resize(N, 0);


	srand(time(0));
	double *left_vector = new double[M];
	double *next_left_vector = new double[M];
	double *right_vector = new double[N];
	double *next_right_vector = new double[N];
	int col = 0;
	for (int col = 0; col < K; col++) {
		double diff = 1;
		double r = -1;
		while (1) {
			for (int i = 0; i < M; i++)
				left_vector[i] = (float)rand() / RAND_MAX;
			if (normalize(left_vector, M) > eps)
				break;
		}

		for (int iter = 0; diff >= eps && iter < MAX_ITER; iter++) {
			memset(next_left_vector, 0, sizeof(double)*M);
			memset(next_right_vector, 0, sizeof(double)*N);
			for (int i = 0; i < M; i++)
				for (int j = 0; j < N; j++)
					next_right_vector[j] += left_vector[i] * A[i][j];

			r = normalize(next_right_vector, N);
			if (r < eps) break;
			for (int i = 0; i < col; i++)
				orth(&V[i][0], next_right_vector, N);
			normalize(next_right_vector, N);

			for (int i = 0; i < M; i++)
				for (int j = 0; j < N; j++)
					next_left_vector[i] += next_right_vector[j] * A[i][j];
			r = normalize(next_left_vector, M);
			if (r < eps) break;
			for (int i = 0; i < col; i++)
				orth(&U[i][0], next_left_vector, M);
			normalize(next_left_vector, M);
			diff = 0;
			for (int i = 0; i < M; i++) {
				double d = next_left_vector[i] - left_vector[i];
				diff += d * d;
			}

			memcpy(left_vector, next_left_vector, sizeof(double)*M);
			memcpy(right_vector, next_right_vector, sizeof(double)*N);
		}
		if (r >= eps) {
			S[col] = r;
			memcpy((char *)&U[col][0], left_vector, sizeof(double)*M);
			memcpy((char *)&V[col][0], right_vector, sizeof(double)*N);
		}
		else {
			cout << r << endl;
			break;
		}
	}
	delete[] next_left_vector;
	delete[] next_right_vector;
	delete[] left_vector;
	delete[] right_vector;

	return true;
}